

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_clear_Test::~VectorSUnitTest_clear_Test(VectorSUnitTest_clear_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, clear)
{
    using vec_t = vector_s<S, 10>;
    vec_t v{S(1u),S(2u),S(3u),S(4u)};
    EXPECT_FALSE(v.empty());
    EXPECT_EQ(4u, v.size());
    EXPECT_EQ(10u, v.capacity());
    EXPECT_EQ(10u, v.max_size());
    EXPECT_EQ(4u, S::count_constructor);
    EXPECT_EQ(4u, S::count_destructor);
    v.clear();
    EXPECT_EQ(static_cast<size_t>(0u), v.size());
    EXPECT_EQ(8u, S::count_destructor);
}